

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O0

void __thiscall
NshHistoryGetEntry_SuccessWhenOverriding_Test::TestBody
          (NshHistoryGetEntry_SuccessWhenOverriding_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_920;
  Message local_918;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_8f8;
  Message local_8f0 [3];
  nsh_status local_8d4;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar;
  char acStack_8b8 [4];
  nsh_status_t status;
  char entry [128];
  char entry_override [10];
  char acStack_826 [2];
  uint i;
  char cStack_820;
  char cStack_81f;
  char new_entry [10];
  nsh_history_t hist;
  NshHistoryGetEntry_SuccessWhenOverriding_Test *this_local;
  
  nsh_history_reset((nsh_history_t *)(new_entry + 2));
  acStack_826[0] = 'n';
  acStack_826[1] = 'e';
  i._0_1_ = 'w';
  i._1_1_ = '_';
  i._2_1_ = 'e';
  i._3_1_ = 'n';
  cStack_820 = 't';
  cStack_81f = 'r';
  new_entry[0] = 'y';
  new_entry[1] = '\0';
  entry_override[4] = '\0';
  entry_override[5] = '\0';
  entry_override[6] = '\0';
  entry_override[7] = '\0';
  for (; (uint)entry_override._4_4_ < 0x10; entry_override._4_4_ = entry_override._4_4_ + 1) {
    nsh_history_add_entry((nsh_history_t *)(new_entry + 2),acStack_826);
  }
  builtin_strncpy(entry + 0x78,"override",8);
  nsh_history_add_entry((nsh_history_t *)(new_entry + 2),entry + 0x78);
  entry[0x68] = '\0';
  entry[0x69] = '\0';
  entry[0x6a] = '\0';
  entry[0x6b] = '\0';
  entry[0x6c] = '\0';
  entry[0x6d] = '\0';
  entry[0x6e] = '\0';
  entry[0x6f] = '\0';
  entry[0x70] = '\0';
  entry[0x71] = '\0';
  entry[0x72] = '\0';
  entry[0x73] = '\0';
  entry[0x74] = '\0';
  entry[0x75] = '\0';
  entry[0x76] = '\0';
  entry[0x77] = '\0';
  entry[0x58] = '\0';
  entry[0x59] = '\0';
  entry[0x5a] = '\0';
  entry[0x5b] = '\0';
  entry[0x5c] = '\0';
  entry[0x5d] = '\0';
  entry[0x5e] = '\0';
  entry[0x5f] = '\0';
  entry[0x60] = '\0';
  entry[0x61] = '\0';
  entry[0x62] = '\0';
  entry[99] = '\0';
  entry[100] = '\0';
  entry[0x65] = '\0';
  entry[0x66] = '\0';
  entry[0x67] = '\0';
  entry[0x48] = '\0';
  entry[0x49] = '\0';
  entry[0x4a] = '\0';
  entry[0x4b] = '\0';
  entry[0x4c] = '\0';
  entry[0x4d] = '\0';
  entry[0x4e] = '\0';
  entry[0x4f] = '\0';
  entry[0x50] = '\0';
  entry[0x51] = '\0';
  entry[0x52] = '\0';
  entry[0x53] = '\0';
  entry[0x54] = '\0';
  entry[0x55] = '\0';
  entry[0x56] = '\0';
  entry[0x57] = '\0';
  entry[0x38] = '\0';
  entry[0x39] = '\0';
  entry[0x3a] = '\0';
  entry[0x3b] = '\0';
  entry[0x3c] = '\0';
  entry[0x3d] = '\0';
  entry[0x3e] = '\0';
  entry[0x3f] = '\0';
  entry[0x40] = '\0';
  entry[0x41] = '\0';
  entry[0x42] = '\0';
  entry[0x43] = '\0';
  entry[0x44] = '\0';
  entry[0x45] = '\0';
  entry[0x46] = '\0';
  entry[0x47] = '\0';
  entry[0x28] = '\0';
  entry[0x29] = '\0';
  entry[0x2a] = '\0';
  entry[0x2b] = '\0';
  entry[0x2c] = '\0';
  entry[0x2d] = '\0';
  entry[0x2e] = '\0';
  entry[0x2f] = '\0';
  entry[0x30] = '\0';
  entry[0x31] = '\0';
  entry[0x32] = '\0';
  entry[0x33] = '\0';
  entry[0x34] = '\0';
  entry[0x35] = '\0';
  entry[0x36] = '\0';
  entry[0x37] = '\0';
  entry[0x18] = '\0';
  entry[0x19] = '\0';
  entry[0x1a] = '\0';
  entry[0x1b] = '\0';
  entry[0x1c] = '\0';
  entry[0x1d] = '\0';
  entry[0x1e] = '\0';
  entry[0x1f] = '\0';
  entry[0x20] = '\0';
  entry[0x21] = '\0';
  entry[0x22] = '\0';
  entry[0x23] = '\0';
  entry[0x24] = '\0';
  entry[0x25] = '\0';
  entry[0x26] = '\0';
  entry[0x27] = '\0';
  entry[8] = '\0';
  entry[9] = '\0';
  entry[10] = '\0';
  entry[0xb] = '\0';
  entry[0xc] = '\0';
  entry[0xd] = '\0';
  entry[0xe] = '\0';
  entry[0xf] = '\0';
  entry[0x10] = '\0';
  entry[0x11] = '\0';
  entry[0x12] = '\0';
  entry[0x13] = '\0';
  entry[0x14] = '\0';
  entry[0x15] = '\0';
  entry[0x16] = '\0';
  entry[0x17] = '\0';
  _acStack_8b8 = 0;
  entry[0] = '\0';
  entry[1] = '\0';
  entry[2] = '\0';
  entry[3] = '\0';
  entry[4] = '\0';
  entry[5] = '\0';
  entry[6] = '\0';
  entry[7] = '\0';
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = nsh_history_get_entry((nsh_history_t *)(new_entry + 2),1,acStack_8b8);
  local_8d4 = NSH_STATUS_OK;
  testing::internal::EqHelper::Compare<nsh_status,_nsh_status,_nullptr>
            ((EqHelper *)local_8d0,"status","NSH_STATUS_OK",
             (nsh_status *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4),&local_8d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(local_8f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8f8,local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    testing::Message::~Message(local_8f0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)local_910,"entry","new_entry",acStack_8b8,acStack_826);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
    if (!bVar1) {
      testing::Message::Message(&local_918);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
      testing::internal::AssertHelper::AssertHelper
                (&local_920,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
                 ,0x9f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_920,&local_918);
      testing::internal::AssertHelper::~AssertHelper(&local_920);
      testing::Message::~Message(&local_918);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  }
  return;
}

Assistant:

TEST(NshHistoryGetEntry, SuccessWhenOverriding)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    for (unsigned int i = 0; i < NSH_CMD_HISTORY_SIZE; i++) {
        nsh_history_add_entry(&hist, new_entry);
    }

    const char entry_override[] = "overriden";
    nsh_history_add_entry(&hist, entry_override);

    char entry[NSH_LINE_BUFFER_SIZE] = {};
    auto status = nsh_history_get_entry(&hist, 1, entry);

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_STREQ(entry, new_entry);
}